

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.h
# Opt level: O0

Numeral * __thiscall
viras::
Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
::add(Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
      *this,Numeral *l,Numeral *r)

{
  VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_RCX;
  RationalConstantType *in_RSI;
  RationalConstantType *in_RDI;
  RationalConstantType *r_00;
  
  r_00 = in_RDI;
  Kernel::RationalConstantType::RationalConstantType(in_RSI,in_RDI);
  Kernel::RationalConstantType::RationalConstantType(in_RSI,r_00);
  Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::add
            (in_RCX,in_RSI,r_00);
  Kernel::RationalConstantType::~RationalConstantType(in_RDI);
  Kernel::RationalConstantType::~RationalConstantType(in_RDI);
  return r_00;
}

Assistant:

Numeral add(Numeral l, Numeral r) { return api.add(l,r); }